

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_2,_2> *
gl4cts::Math::inverse<2>(Matrix<double,_2,_2> *__return_storage_ptr__,Matrix<double,_2,_2> *matrix)

{
  undefined8 *puVar1;
  Matrix<double,_2,_2> *pMVar2;
  Matrix<double,_2,_2> *pMVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  undefined8 uVar10;
  double dVar11;
  Matrix<double,_2,_2> adjugate;
  Matrix<double,_2,_2> cof;
  Matrix<double,_2,_2> local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  pMVar2 = &local_48;
  pMVar3 = &local_48;
  puVar1 = &local_28;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar10 = 0x3ff0000000000000;
      if (lVar4 != lVar7) {
        uVar10 = 0;
      }
      *(undefined8 *)((long)puVar1 + lVar7) = uVar10;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 == 0x10);
    puVar1 = puVar1 + 1;
    lVar4 = lVar4 + 0x10;
    bVar9 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar9);
  puVar1 = &local_28;
  uVar5 = 0;
  do {
    uVar8 = 0;
    do {
      dVar11 = (matrix->m_data).m_data[uVar5 ^ 1].m_data[uVar8 ^ 1];
      if (((int)uVar5 + (int)uVar8 & 1U) != 0) {
        dVar11 = -dVar11;
      }
      puVar1[uVar8] = dVar11;
      uVar8 = uVar8 + 1;
    } while (uVar8 == 1);
    puVar1 = puVar1 + 2;
    bVar9 = uVar5 == 0;
    uVar5 = uVar5 + 1;
  } while (bVar9);
  local_48.m_data.m_data[1].m_data[0] = 0.0;
  local_48.m_data.m_data[1].m_data[1] = 0.0;
  local_48.m_data.m_data[0].m_data[0] = 0.0;
  local_48.m_data.m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar10 = 0x3ff0000000000000;
      if (lVar4 != lVar7) {
        uVar10 = 0;
      }
      *(undefined8 *)((long)pMVar2 + lVar7) = uVar10;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 == 0x10);
    pMVar2 = (Matrix<double,_2,_2> *)((long)pMVar2 + 8);
    lVar4 = lVar4 + 0x10;
    bVar9 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar9);
  puVar1 = &local_28;
  lVar6 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pMVar3 + lVar4) = *(undefined8 *)((long)puVar1 + lVar4 * 2);
      lVar4 = lVar4 + 8;
    } while (lVar4 == 8);
    pMVar3 = (Matrix<double,_2,_2> *)((long)pMVar3 + 0x10);
    puVar1 = puVar1 + 1;
    bVar9 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar9);
  tcu::operator*(__return_storage_ptr__,&local_48,
                 1.0 / ((matrix->m_data).m_data[0].m_data[0] * (matrix->m_data).m_data[1].m_data[1]
                       - (matrix->m_data).m_data[1].m_data[0] * (matrix->m_data).m_data[0].m_data[1]
                       ));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}